

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImportBaseDirWrapper.cpp
# Opt level: O0

ImportBaseFuncWrapper * __thiscall
ImportBaseDirWrapper::thunkToFunction(ImportBaseDirWrapper *this,offset_t thunk)

{
  iterator iVar1;
  bool bVar2;
  pointer ppVar3;
  long lVar4;
  ImportBaseDirWrapper *local_58;
  ImportBaseFuncWrapper *func;
  _Self local_30;
  iterator funcItr;
  ImportBaseEntryWrapper *lib;
  offset_t thunk_local;
  ImportBaseDirWrapper *this_local;
  
  lib = (ImportBaseEntryWrapper *)thunk;
  thunk_local = (offset_t)this;
  funcItr._M_node = (_Base_ptr)thunkToLib(this,thunk);
  if ((ImportBaseEntryWrapper *)funcItr._M_node == (ImportBaseEntryWrapper *)0x0) {
    this_local = (ImportBaseDirWrapper *)0x0;
  }
  else {
    local_30._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
         ::find(&((ImportBaseEntryWrapper *)funcItr._M_node)->thunkToFuncMap,(key_type *)&lib);
    func = (ImportBaseFuncWrapper *)
           std::
           map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           ::end((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                  *)&funcItr._M_node[2]._M_parent);
    bVar2 = std::operator==(&local_30,(_Self *)&func);
    iVar1 = funcItr;
    if (bVar2) {
      this_local = (ImportBaseDirWrapper *)0x0;
    }
    else {
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator->
                         (&local_30);
      lVar4 = (**(code **)(*(long *)iVar1._M_node + 0x100))(iVar1._M_node,ppVar3->second);
      if (lVar4 == 0) {
        local_58 = (ImportBaseDirWrapper *)0x0;
      }
      else {
        local_58 = (ImportBaseDirWrapper *)
                   __dynamic_cast(lVar4,&ExeNodeWrapper::typeinfo,&ImportBaseFuncWrapper::typeinfo,0
                                 );
      }
      this_local = local_58;
    }
  }
  return (ImportBaseFuncWrapper *)this_local;
}

Assistant:

ImportBaseFuncWrapper* ImportBaseDirWrapper::thunkToFunction(offset_t thunk)
{
    ImportBaseEntryWrapper* lib = thunkToLib(thunk);
    if (!lib) return NULL;

    std::map<offset_t, size_t>::iterator funcItr = lib->thunkToFuncMap.find(thunk);
    if (funcItr == lib->thunkToFuncMap.end()) return NULL;

    ImportBaseFuncWrapper* func = dynamic_cast<ImportBaseFuncWrapper*>(lib->getEntryAt(funcItr->second));
    return func;
}